

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_tonumber_(TValue *obj,lua_Number *n)

{
  int iVar1;
  TValue v;
  
  if (obj->tt_ == '\x03') {
    v.value_.n = (lua_Number)(obj->value_).i;
  }
  else {
    iVar1 = l_strton(obj,&v);
    if (iVar1 == 0) {
      return 0;
    }
    if (v.tt_ == '\x03') {
      v.value_.n = (lua_Number)v.value_.i;
    }
  }
  *n = (lua_Number)v.value_;
  return 1;
}

Assistant:

int luaV_tonumber_ (const TValue *obj, lua_Number *n) {
  TValue v;
  if (ttisinteger(obj)) {
    *n = cast_num(ivalue(obj));
    return 1;
  }
  else if (l_strton(obj, &v)) {  /* string coercible to number? */
    *n = nvalue(&v);  /* convert result of 'luaO_str2num' to a float */
    return 1;
  }
  else
    return 0;  /* conversion failed */
}